

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O0

void __thiscall HighsCliqueTable::cleanupFixed(HighsCliqueTable *this,HighsDomain *globaldom)

{
  double dVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  HighsDomain *in_RSI;
  HighsDomain *in_RDI;
  HighsCliqueTable *unaff_retaddr;
  HighsDomain *in_stack_00000008;
  HighsCliqueTable *in_stack_00000010;
  CliqueVar v;
  HighsInt fixval;
  HighsInt i;
  HighsInt oldnfixings;
  HighsInt numcol;
  CliqueVar local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  HighsDomain *globaldom_00;
  
  globaldom_00 = in_RDI;
  sVar3 = std::vector<double,_std::allocator<double>_>::size(&in_RSI->col_upper_);
  local_14 = (int)sVar3;
  local_18 = *(int *)&(in_RDI->objProp_).partitionCliqueData.
                      super__Vector_base<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
  local_1c = 0;
  do {
    if (local_1c == local_14) {
      if (*(int *)&(in_RDI->objProp_).partitionCliqueData.
                   super__Vector_base<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
                   ._M_impl.super__Vector_impl_data._M_finish != local_18) {
        propagateAndCleanup(in_stack_00000010,in_stack_00000008);
      }
      return;
    }
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &(in_RDI->objProp_).objectiveLowerContributions,(long)local_1c);
    if (*pvVar4 == '\0') {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RSI->col_lower_,(long)local_1c);
      dVar1 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RSI->col_upper_,(long)local_1c);
      if ((dVar1 == *pvVar5) && (!NAN(dVar1) && !NAN(*pvVar5))) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RSI->col_lower_,(long)local_1c);
        if ((*pvVar5 != 1.0) || (NAN(*pvVar5))) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RSI->col_lower_,(long)local_1c);
          if ((*pvVar5 != 0.0) || (NAN(*pvVar5))) goto LAB_0053bc17;
        }
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RSI->col_lower_,(long)local_1c);
        local_20 = (int)*pvVar5;
        CliqueVar::CliqueVar(&local_24,local_1c,1 - local_20);
        vertexInfeasible(unaff_retaddr,globaldom_00,(HighsInt)((ulong)in_RSI >> 0x20),
                         (HighsInt)in_RSI);
        bVar2 = HighsDomain::infeasible(in_RSI);
        if (bVar2) {
          return;
        }
      }
    }
LAB_0053bc17:
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

void HighsCliqueTable::cleanupFixed(HighsDomain& globaldom) {
  HighsInt numcol = globaldom.col_upper_.size();
  HighsInt oldnfixings = nfixings;
  for (HighsInt i = 0; i != numcol; ++i) {
    if (colDeleted[i] || globaldom.col_lower_[i] != globaldom.col_upper_[i])
      continue;
    if (globaldom.col_lower_[i] != 1.0 && globaldom.col_lower_[i] != 0.0)
      continue;

    HighsInt fixval = (HighsInt)globaldom.col_lower_[i];
    CliqueVar v(i, 1 - fixval);

    vertexInfeasible(globaldom, v.col, v.val);
    if (globaldom.infeasible()) return;
  }

  if (nfixings != oldnfixings) propagateAndCleanup(globaldom);
}